

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathPositionFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr value;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 0) {
      if (ctxt->valueNr < ctxt->valueFrame) {
        xmlXPathErr(ctxt,0x17);
      }
      else if (ctxt->context->proximityPosition < 0) {
        xmlXPathErr(ctxt,0xe);
      }
      else {
        value = xmlXPathCacheNewFloat(ctxt->context,(double)ctxt->context->proximityPosition);
        valuePush(ctxt,value);
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathPositionFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    CHECK_ARITY(0);
    if (ctxt->context->proximityPosition >= 0) {
	valuePush(ctxt,
	      xmlXPathCacheNewFloat(ctxt->context,
		(double) ctxt->context->proximityPosition));
#ifdef DEBUG_EXPR
	xmlGenericError(xmlGenericErrorContext, "position() : %d\n",
		ctxt->context->proximityPosition);
#endif
    } else {
	XP_ERROR(XPATH_INVALID_CTXT_POSITION);
    }
}